

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

Section * out_OverlappingSection(Section *section)

{
  SortedSection *local_28;
  SortedSection *ptr;
  SortedSections *banks;
  Section *section_local;
  
  local_28 = sections[section->type].banks[section->bank - sectionTypeInfo[section->type].firstBank]
             .sections;
  while( true ) {
    if (local_28 == (SortedSection *)0x0) {
      return (Section *)0x0;
    }
    if (((uint)local_28->section->org < (uint)section->org + (uint)section->size) &&
       ((uint)section->org < (uint)local_28->section->org + (uint)local_28->section->size)) break;
    local_28 = local_28->next;
  }
  return local_28->section;
}

Assistant:

struct Section const *out_OverlappingSection(struct Section const *section)
{
	struct SortedSections *banks = sections[section->type].banks;
	struct SortedSection *ptr =
		banks[section->bank - sectionTypeInfo[section->type].firstBank].sections;

	while (ptr) {
		if (ptr->section->org < section->org + section->size
		 && section->org < ptr->section->org + ptr->section->size)
			return ptr->section;
		ptr = ptr->next;
	}
	return NULL;
}